

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O0

void __thiscall
capnp::compiler::CompilerMain::ParseErrorCatcher::~ParseErrorCatcher(ParseErrorCatcher *this)

{
  ProcessContext *pPVar1;
  bool bVar2;
  undefined4 in_stack_ffffffffffffff50;
  int local_74;
  char *local_70;
  ArrayPtr<const_char> local_68;
  String local_58;
  StringPtr local_40;
  Exception *local_30;
  Exception *e;
  Exception *_e1001;
  ParseErrorCatcher *local_10;
  ParseErrorCatcher *this_local;
  
  (this->super_ExceptionCallback)._vptr_ExceptionCallback =
       (_func_int **)&PTR__ParseErrorCatcher_004c16a8;
  local_10 = this;
  bVar2 = kj::UnwindDetector::isUnwinding(&this->unwindDetector);
  if (!bVar2) {
    e = kj::_::readMaybe<kj::Exception>(&this->exception);
    if (e != (Exception *)0x0) {
      pPVar1 = this->context;
      local_30 = e;
      local_68 = (ArrayPtr<const_char>)kj::Exception::getDescription(e);
      local_70 = kj::Exception::getFile(local_30);
      local_74 = kj::Exception::getLine(local_30);
      kj::
      str<char_const(&)[165],char_const(&)[24],kj::StringPtr,char_const(&)[17],char_const*,char_const(&)[2],int,char_const(&)[19]>
                (&local_58,
                 (kj *)
                 "*** ERROR CONVERTING PREVIOUS MESSAGE ***\nThe following error occurred while converting the message above.\nThis probably means the input data is invalid/corrupted.\n"
                 ,(char (*) [165])"Exception description: ",(char (*) [24])&local_68,
                 (StringPtr *)"\nCode location: ",(char (*) [17])&local_70,(char **)0x3c5b58,
                 (char (*) [2])&local_74,(int *)"\n*** END ERROR ***",
                 (char (*) [19])CONCAT44(local_74,in_stack_ffffffffffffff50));
      kj::StringPtr::StringPtr(&local_40,&local_58);
      (*pPVar1->_vptr_ProcessContext[3])(pPVar1,local_40.content.ptr,local_40.content.size_);
      kj::String::~String(&local_58);
    }
  }
  kj::Maybe<kj::Exception>::~Maybe(&this->exception);
  kj::ExceptionCallback::~ExceptionCallback(&this->super_ExceptionCallback);
  return;
}

Assistant:

~ParseErrorCatcher() noexcept(false) {
      if (!unwindDetector.isUnwinding()) {
        KJ_IF_SOME(e, exception) {
          context.error(kj::str(
              "*** ERROR CONVERTING PREVIOUS MESSAGE ***\n"
              "The following error occurred while converting the message above.\n"
              "This probably means the input data is invalid/corrupted.\n",
              "Exception description: ", e.getDescription(), "\n"
              "Code location: ", e.getFile(), ":", e.getLine(), "\n"
              "*** END ERROR ***"));
        }
      }
    }